

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void closelistfield(FuncState *fs,ConsControl *cc)

{
  ConsControl *cc_local;
  FuncState *fs_local;
  
  if ((cc->v).k != VVOID) {
    luaK_exp2nextreg(fs,&cc->v);
    (cc->v).k = VVOID;
    if (cc->tostore == 0x32) {
      luaK_setlist(fs,(cc->t->u).info,cc->na,cc->tostore);
      cc->na = cc->tostore + cc->na;
      cc->tostore = 0;
    }
  }
  return;
}

Assistant:

static void closelistfield (FuncState *fs, ConsControl *cc) {
  if (cc->v.k == VVOID) return;  /* there is no list item */
  luaK_exp2nextreg(fs, &cc->v);
  cc->v.k = VVOID;
  if (cc->tostore == LFIELDS_PER_FLUSH) {
    luaK_setlist(fs, cc->t->u.info, cc->na, cc->tostore);  /* flush */
    cc->na += cc->tostore;
    cc->tostore = 0;  /* no more items pending */
  }
}